

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ActivationPReLU * __thiscall
CoreML::Specification::ActivationParams::mutable_prelu(ActivationParams *this)

{
  ActivationLinear *this_00;
  
  if (this->_oneof_case_[0] == 0x19) {
    this_00 = (this->NonlinearityType_).linear_;
  }
  else {
    clear_NonlinearityType(this);
    this->_oneof_case_[0] = 0x19;
    this_00 = (ActivationLinear *)operator_new(0x20);
    ActivationPReLU::ActivationPReLU((ActivationPReLU *)this_00);
    (this->NonlinearityType_).prelu_ = (ActivationPReLU *)this_00;
  }
  return (ActivationPReLU *)this_00;
}

Assistant:

inline ::CoreML::Specification::ActivationPReLU* ActivationParams::mutable_prelu() {
  if (!has_prelu()) {
    clear_NonlinearityType();
    set_has_prelu();
    NonlinearityType_.prelu_ = new ::CoreML::Specification::ActivationPReLU;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.ActivationParams.PReLU)
  return NonlinearityType_.prelu_;
}